

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O3

void __thiscall Tree<int>::levelTraversal(Tree<int> *this)

{
  Node<int> *pNVar1;
  TCallBack<int> *pTVar2;
  _func_int_ptr_int_ptr *p_Var3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  queue<Node<int>_*,_std::deque<Node<int>_*,_std::allocator<Node<int>_*>_>_> myQueue;
  Node<int> *local_90;
  _Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_> local_88;
  
  iVar4 = (*this->_vptr_Tree[8])();
  if (CONCAT44(extraout_var,iVar4) != 0) {
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_>::_M_initialize_map(&local_88,0);
    iVar4 = (*this->_vptr_Tree[8])(this);
    local_90 = (Node<int> *)CONCAT44(extraout_var_00,iVar4);
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<Node<int>*,std::allocator<Node<int>*>>::_M_push_back_aux<Node<int>*>
                ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_88,&local_90);
    }
    else {
      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_90 = (Node<int> *)0x0;
    if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<Node<int>*,std::allocator<Node<int>*>>::_M_push_back_aux<Node<int>*>
                ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_88,&local_90);
    }
    else {
      *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (Node<int> *)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    do {
      pNVar1 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      if (pNVar1 == (Node<int> *)0x0) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_90 = (Node<int> *)0x0;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Node<int>*,std::allocator<Node<int>*>>::_M_push_back_aux<Node<int>*>
                      ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (Node<int> *)0x0;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
        }
      }
      else {
        pTVar2 = this->callBack;
        if (pTVar2 != (TCallBack<int> *)0x0) {
          iVar4 = (*pNVar1->_vptr_Node[4])(pNVar1);
          (*(code *)**(undefined8 **)pTVar2)(pTVar2,iVar4);
        }
        p_Var3 = this->fCallBack;
        if (p_Var3 != (_func_int_ptr_int_ptr *)0x0) {
          iVar4 = (*pNVar1->_vptr_Node[4])(pNVar1);
          (*p_Var3)((int *)CONCAT44(extraout_var_01,iVar4));
        }
        iVar4 = (**pNVar1->_vptr_Node)(pNVar1);
        if (CONCAT44(extraout_var_02,iVar4) != 0) {
          iVar4 = (**pNVar1->_vptr_Node)(pNVar1);
          local_90 = (Node<int> *)CONCAT44(extraout_var_03,iVar4);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Node<int>*,std::allocator<Node<int>*>>::_M_push_back_aux<Node<int>*>
                      ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        iVar4 = (*pNVar1->_vptr_Node[8])(pNVar1);
        if (CONCAT44(extraout_var_04,iVar4) != 0) {
          iVar4 = (*pNVar1->_vptr_Node[8])(pNVar1);
          local_90 = (Node<int> *)CONCAT44(extraout_var_05,iVar4);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<Node<int>*,std::allocator<Node<int>*>>::_M_push_back_aux<Node<int>*>
                      ((deque<Node<int>*,std::allocator<Node<int>*>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::_Deque_base<Node<int>_*,_std::allocator<Node<int>_*>_>::~_Deque_base(&local_88);
  }
  return;
}

Assistant:

virtual void levelTraversal(void){
        if (getRoot() == nullptr){
            return;
        }
        queue<Node<T>*> myQueue;
        myQueue.push(getRoot());
        myQueue.push(0); // nullptr

        do{
            Node<T>* node = myQueue.front();
            myQueue.pop();
            if (node){ // node != nullptr
                doSomeThing(node);
                if (node->getLeftPoint() != nullptr){
                    myQueue.push( node->getLeftPoint());
                }
                if (node->getRightPoint() != nullptr){
                    myQueue.push(node->getRightPoint());
                }
            } else{
                if (!myQueue.empty()){
                    //end the the level
                    myQueue.push(0);
                    cout << endl;
                }
            }
        }while (!myQueue.empty());
    }